

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVectorUtil.hpp
# Opt level: O0

Vector<unsigned_int,_4> __thiscall
tcu::select<unsigned_int,4>
          (tcu *this,Vector<unsigned_int,_4> *trueVal,Vector<unsigned_int,_4> *falseVal,
          Vector<bool,_4> *cond)

{
  bool *pbVar1;
  uint *puVar2;
  undefined8 extraout_RDX;
  undefined8 uVar3;
  undefined8 extraout_RDX_00;
  Vector<unsigned_int,_4> VVar4;
  undefined4 local_44;
  undefined4 local_2c;
  int i;
  Vector<bool,_4> *cond_local;
  Vector<unsigned_int,_4> *falseVal_local;
  Vector<unsigned_int,_4> *trueVal_local;
  Vector<unsigned_int,_4> *res;
  
  Vector<unsigned_int,_4>::Vector((Vector<unsigned_int,_4> *)this);
  uVar3 = extraout_RDX;
  for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
    pbVar1 = Vector<bool,_4>::operator[](cond,local_2c);
    if ((*pbVar1 & 1U) == 0) {
      puVar2 = Vector<unsigned_int,_4>::operator[](falseVal,local_2c);
      local_44 = *puVar2;
    }
    else {
      puVar2 = Vector<unsigned_int,_4>::operator[](trueVal,local_2c);
      local_44 = *puVar2;
    }
    puVar2 = Vector<unsigned_int,_4>::operator[]((Vector<unsigned_int,_4> *)this,local_2c);
    *puVar2 = local_44;
    uVar3 = extraout_RDX_00;
  }
  VVar4.m_data[2] = (int)uVar3;
  VVar4.m_data[3] = (int)((ulong)uVar3 >> 0x20);
  VVar4.m_data._0_8_ = this;
  return (Vector<unsigned_int,_4>)VVar4.m_data;
}

Assistant:

inline Vector<T, Size> select (const Vector<T, Size>& trueVal, const Vector<T, Size>& falseVal, const Vector<bool, Size>& cond)
{
	Vector<T, Size> res;
	for (int i = 0; i < Size; i++)
		res[i] = cond[i] ? trueVal[i] : falseVal[i];
	return res;
}